

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.cpp
# Opt level: O0

int __thiscall node::backspace(node *this,int line,int index)

{
  ulong uVar1;
  reference pvVar2;
  long lVar3;
  long lVar4;
  reference this_00;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_c8;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_c0;
  const_iterator local_b8;
  string local_b0 [48];
  string local_80 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40 [32];
  int local_20;
  int local_1c;
  int index_local;
  int line_local;
  node *this_local;
  
  local_20 = index;
  local_1c = line;
  _index_local = this;
  if (index < 1) {
    if (0 < line) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[](&this->inputCode,(long)(line + -1));
      lVar3 = std::__cxx11::string::length();
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[](&this->inputCode,(long)local_1c);
      lVar4 = std::__cxx11::string::length();
      if (((ulong)(lVar3 + lVar4) < 0x12) && (local_20 == 0)) {
        pvVar2 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](&this->inputCode,(long)local_1c);
        this_00 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::operator[](&this->inputCode,(long)(local_1c + -1));
        std::__cxx11::string::operator+=((string *)this_00,(string *)pvVar2);
        local_c8._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(&this->inputCode);
        local_c0 = __gnu_cxx::
                   __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator+(&local_c8,(long)local_1c);
        __gnu_cxx::
        __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
        ::__normal_iterator<std::__cxx11::string*>
                  ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                    *)&local_b8,&local_c0);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::erase(&this->inputCode,local_b8);
        return 2;
      }
    }
    this_local._4_4_ = 0;
  }
  else {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[](&this->inputCode,(long)line);
    uVar1 = std::__cxx11::string::length();
    if ((ulong)(long)local_20 < uVar1) {
      pvVar2 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](&this->inputCode,(long)local_1c);
      std::__cxx11::string::substr((ulong)local_60,(ulong)pvVar2);
      pvVar2 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](&this->inputCode,(long)local_1c);
      std::__cxx11::string::substr((ulong)local_80,(ulong)pvVar2);
      std::operator+(local_40,local_60);
      pvVar2 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](&this->inputCode,(long)local_1c);
      std::__cxx11::string::operator=((string *)pvVar2,(string *)local_40);
      std::__cxx11::string::~string((string *)local_40);
      std::__cxx11::string::~string(local_80);
      std::__cxx11::string::~string((string *)local_60);
    }
    else {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[](&this->inputCode,(long)local_1c);
      lVar3 = std::__cxx11::string::length();
      if (lVar3 == local_20) {
        pvVar2 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](&this->inputCode,(long)local_1c);
        std::__cxx11::string::substr((ulong)local_b0,(ulong)pvVar2);
        pvVar2 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](&this->inputCode,(long)local_1c);
        std::__cxx11::string::operator=((string *)pvVar2,local_b0);
        std::__cxx11::string::~string(local_b0);
      }
    }
    this_local._4_4_ = 1;
  }
  return this_local._4_4_;
}

Assistant:

int node::backspace(int line, int index) {
  if (index > 0) {
    if (inputCode[line].length() > index) {
      inputCode[line] = inputCode[line].substr(0, index - 1) + inputCode[line].substr(index);
    } else if (inputCode[line].length() == index) {
      inputCode[line] = inputCode[line].substr(0, index - 1);
    }
    return 1;
  } else if(line > 0 && inputCode[line - 1].length() + inputCode[line].length() <= MAX_LINE_LENGTH && index == 0) {
    inputCode[line - 1] += inputCode[line];
    inputCode.erase(inputCode.begin() + line);
    return 2;
  }
  
  return 0;
}